

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_builtins.hpp
# Opt level: O0

uint8_t unodb::detail::ctz<unsigned_long_long>(unsigned_long_long x)

{
  uint8_t uVar1;
  unsigned_long_long x_local;
  
  uVar1 = '\0';
  for (; (x & 1) == 0; x = x >> 1 | 0x8000000000000000) {
    uVar1 = uVar1 + '\x01';
  }
  return uVar1;
}

Assistant:

[[nodiscard, gnu::const]] UNODB_DETAIL_CONSTEXPR_NOT_MSVC std::uint8_t ctz(
    T x) noexcept {
  static_assert(std::is_same_v<unsigned, T> ||
                // NOLINTNEXTLINE(google-runtime-int)
                std::is_same_v<unsigned long, T> ||  // NOLINT(runtime/int)
                // NOLINTNEXTLINE(google-runtime-int)
                std::is_same_v<unsigned long long, T>);  // NOLINT(runtime/int)

  if constexpr (std::is_same_v<unsigned, T>) {
#ifndef UNODB_DETAIL_MSVC
    return static_cast<std::uint8_t>(__builtin_ctz(x));
#else
    unsigned long result;  // NOLINT(runtime/int)
    _BitScanForward(&result, x);
    return static_cast<std::uint8_t>(result);
#endif
  }
  // NOLINTNEXTLINE(google-runtime-int)
  if constexpr (std::is_same_v<unsigned long, T>) {  // NOLINT(runtime/int)
#ifndef UNODB_DETAIL_MSVC
    return static_cast<std::uint8_t>(__builtin_ctzl(x));
#else
    unsigned long result;  // NOLINT(runtime/int)
    _BitScanForward(&result, x);
    return static_cast<std::uint8_t>(result);
#endif
  }
  // NOLINTNEXTLINE(google-runtime-int)
  if constexpr (std::is_same_v<unsigned long long, T>) {  // NOLINT(runtime/int)
#ifndef UNODB_DETAIL_MSVC
    return static_cast<std::uint8_t>(__builtin_ctzll(x));
#else
    unsigned long result;  // NOLINT(runtime/int)
    _BitScanForward64(&result, x);
    return static_cast<std::uint8_t>(result);
#endif
  }  // cppcheck-suppress missingReturn
}